

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O1

stbi_uc * dds_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  uint8 *__src;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint32 uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  undefined4 in_register_00000084;
  int iVar16;
  uchar *puVar17;
  uint uVar18;
  bool bVar19;
  stbi_uc compressed [8];
  DDS_header header;
  stbi_uc block [64];
  undefined8 local_160;
  uint local_158;
  uint local_154;
  ulong local_150;
  int local_148;
  uint local_144;
  int local_140;
  uint local_13c;
  int *local_138;
  uint32 *local_130;
  stbi *local_128;
  ulong local_120;
  uchar *local_118;
  undefined8 local_110;
  ulong local_108;
  ulong local_100;
  int local_f8;
  int local_f4;
  uint local_f0;
  uint32 local_ec;
  uint32 local_e8;
  uint local_dc;
  int local_ac;
  uint local_a8;
  uint local_a4;
  uint local_8c;
  uint local_88;
  uchar local_78 [72];
  
  local_110 = CONCAT44(in_register_00000084,req_comp);
  local_138 = comp;
  local_130 = (uint32 *)y;
  if ((FILE *)s->img_file == (FILE *)0x0) {
    __src = s->img_buffer;
    memcpy(&local_f8,__src,0x80);
    s->img_buffer = __src + 0x80;
  }
  else {
    fread(&local_f8,1,0x80,(FILE *)s->img_file);
  }
  if (local_f8 != 0x20534444) {
    return (stbi_uc *)0x0;
  }
  if (local_f4 != 0x7c) {
    return (stbi_uc *)0x0;
  }
  if ((~local_f0 & 0x1007) != 0) {
    return (stbi_uc *)0x0;
  }
  if (local_ac != 0x20) {
    return (stbi_uc *)0x0;
  }
  if (((local_a8 & 0x44) == 0) || ((local_8c >> 0xc & 1) == 0)) {
LAB_001c6b41:
    puVar17 = (stbi_uc *)0x0;
  }
  else {
    s->img_x = local_e8;
    s->img_y = local_ec;
    s->img_n = 4;
    bVar13 = 1 < local_dc & (byte)(local_8c >> 0x16);
    uVar14 = (local_88 >> 9 & 1) * 5 + 1;
    if (local_e8 != local_ec) {
      uVar14 = 1;
    }
    *x = local_e8;
    *local_130 = s->img_y;
    *local_138 = s->img_n;
    if ((local_a8 & 4) == 0) {
      iVar2 = (local_a8 & 1) + 3;
      s->img_n = iVar2;
      *local_138 = iVar2;
      local_158 = s->img_x * uVar14 * s->img_y * s->img_n;
      puVar17 = (uchar *)malloc((long)(int)local_158);
      uVar18 = 0;
      do {
        iVar2 = s->img_y * s->img_x * s->img_n;
        getn(s,puVar17 + iVar2 * uVar18,iVar2);
        if (bVar13 != 0) {
          uVar11 = 1;
          do {
            uVar3 = s->img_x >> ((byte)uVar11 & 0x1f);
            uVar9 = s->img_y >> ((byte)uVar11 & 0x1f);
            if ((int)uVar3 < 2) {
              uVar3 = 1;
            }
            if ((int)uVar9 < 2) {
              uVar9 = 1;
            }
            lVar15 = (long)(int)(uVar3 * s->img_n * uVar9);
            if ((FILE *)s->img_file == (FILE *)0x0) {
              s->img_buffer = s->img_buffer + lVar15;
            }
            else {
              fseek((FILE *)s->img_file,lVar15,1);
            }
            uVar11 = uVar11 + 1;
          } while (local_dc != uVar11);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar14);
      if (0 < (int)local_158) {
        iVar2 = s->img_n;
        lVar15 = 0;
        do {
          uVar1 = puVar17[lVar15];
          puVar17[lVar15] = puVar17[lVar15 + 2];
          puVar17[lVar15 + 2] = uVar1;
          lVar15 = lVar15 + iVar2;
        } while (lVar15 < (long)(ulong)local_158);
      }
    }
    else {
      local_108 = (ulong)local_a4;
      local_150 = 0;
      if (local_a4 + 0xca000000 < 0xfb000000) goto LAB_001c6b41;
      local_13c = local_e8 + 3 >> 2;
      local_154 = (local_ec + 3 >> 2) * local_13c;
      iVar2 = (local_a4 >> 0x18) - 0x30;
      local_158 = s->img_x * uVar14 * s->img_y * 4;
      local_118 = (uchar *)malloc((long)(int)local_158);
      local_140 = iVar2;
      local_144 = local_e8 + 3 & 0x3ffffffc;
      uVar10 = (ulong)-local_dc;
      local_100 = uVar10;
      local_128 = s;
      local_148 = (iVar2 != 1) + 3;
      do {
        if (0 < (int)local_154) {
          uVar12 = 0;
          do {
            uVar10 = (ulong)local_13c;
            __stream = (FILE *)s->img_file;
            local_120 = uVar12;
            if (local_140 == 1) {
              if (__stream == (FILE *)0x0) {
                local_160 = *(undefined8 *)s->img_buffer;
                s->img_buffer = s->img_buffer + 8;
              }
              else {
                fread(&local_160,1,8,__stream);
              }
              stbi_decode_DXT1_block(local_78,(uchar *)&local_160);
            }
            else {
              if ((uint)local_108 < 0x34000000) {
                if (__stream == (FILE *)0x0) {
                  local_160 = *(undefined8 *)s->img_buffer;
                  s->img_buffer = s->img_buffer + 8;
                }
                else {
                  fread(&local_160,1,8,__stream);
                }
                uVar5 = 0;
                do {
                  iVar2 = (*(byte *)((long)&local_160 + (uVar5 >> 3 & 0x1fffffff)) >>
                           ((byte)uVar5 & 4) & 0xf) * 0xff;
                  local_78[uVar5 + 3] = (uchar)(iVar2 + (iVar2 + 8U >> 4) + 8 >> 4);
                  uVar6 = uVar5 + 3;
                  uVar5 = uVar5 + 4;
                } while (uVar6 < 0x3c);
              }
              else {
                if (__stream == (FILE *)0x0) {
                  local_160 = *(undefined8 *)s->img_buffer;
                  s->img_buffer = s->img_buffer + 8;
                }
                else {
                  fread(&local_160,1,8,__stream);
                }
                stbi_decode_DXT45_alpha_block(local_78,(uchar *)&local_160);
              }
              if ((FILE *)s->img_file == (FILE *)0x0) {
                local_160 = *(undefined8 *)s->img_buffer;
                s->img_buffer = s->img_buffer + 8;
              }
              else {
                fread(&local_160,1,8,(FILE *)s->img_file);
              }
              stbi_decode_DXT_color_block(local_78,(uchar *)&local_160);
            }
            iVar2 = (int)(uVar12 / uVar10);
            uVar18 = s->img_y + iVar2 * -4;
            if (iVar2 * 4 + 4U <= s->img_y) {
              uVar18 = 4;
            }
            if (0 < (int)uVar18) {
              iVar7 = (int)local_120;
              iVar4 = (int)(uVar12 % uVar10);
              uVar11 = local_128->img_x;
              uVar3 = (uVar11 + iVar4 * -4) * 4;
              if (iVar4 * 4 + 4U <= uVar11) {
                uVar3 = 0x10;
              }
              iVar4 = (int)local_150;
              iVar16 = iVar2 * local_144;
              uVar9 = 0;
              uVar10 = 0;
              do {
                if (0 < (int)uVar3) {
                  memcpy(local_118 +
                         (int)(uVar11 * 4 * (int)uVar10 +
                              (((iVar4 * uVar11 + iVar2 * 4) * uVar11 + iVar7 * 4) - iVar16) * 4),
                         local_78 + uVar9,(ulong)uVar3);
                }
                uVar10 = uVar10 + 1;
                uVar9 = uVar9 + 0x10;
              } while (uVar10 < uVar18);
            }
            uVar18 = (int)local_120 + 1;
            uVar12 = (ulong)uVar18;
            uVar10 = local_100;
            s = local_128;
          } while (uVar18 != local_154);
        }
        puVar17 = local_118;
        iVar2 = local_148;
        if (bVar13 != 0) {
          iVar7 = 3;
          do {
            uVar18 = s->img_x >> ((byte)iVar7 & 0x1f);
            uVar11 = s->img_y >> ((byte)iVar7 & 0x1f);
            if ((int)uVar18 < 2) {
              uVar18 = 1;
            }
            if ((int)uVar11 < 2) {
              uVar11 = 1;
            }
            iVar4 = uVar11 * uVar18 << ((byte)iVar2 & 0x1f);
            if ((FILE *)s->img_file == (FILE *)0x0) {
              s->img_buffer = s->img_buffer + iVar4;
            }
            else {
              fseek((FILE *)s->img_file,(long)iVar4,1);
            }
            iVar4 = iVar7 + (int)uVar10;
            iVar7 = iVar7 + 1;
          } while (iVar4 != 1);
        }
        uVar18 = (int)local_150 + 1;
        local_150 = (ulong)uVar18;
      } while (uVar18 != uVar14);
    }
    uVar8 = uVar14 * s->img_y;
    s->img_y = uVar8;
    *local_130 = uVar8;
    iVar2 = s->img_n;
    if ((int)local_158 < 4 || iVar2 != 4) {
      bVar19 = false;
    }
    else {
      uVar10 = 7;
      do {
        lVar15 = uVar10 - 4;
        bVar19 = puVar17[lVar15] != 0xff;
        if (local_158 <= uVar10) break;
        uVar10 = uVar10 + 4;
      } while (puVar17[lVar15] == 0xff);
    }
    iVar7 = (int)local_110;
    if (iVar7 - 1U < 4) {
      if (iVar2 == iVar7) {
        return puVar17;
      }
      puVar17 = convert_format(puVar17,iVar2,iVar7,s->img_x,s->img_y);
      iVar2 = s->img_n;
    }
    else {
      if (iVar2 != 4 || bVar19) {
        return puVar17;
      }
      iVar2 = 3;
      puVar17 = convert_format(puVar17,4,3,s->img_x,s->img_y);
    }
    *local_138 = iVar2;
  }
  return puVar17;
}

Assistant:

static stbi_uc *dds_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
	//	all variables go up front
	stbi_uc *dds_data = NULL;
	stbi_uc block[16*4];
	stbi_uc compressed[8];
	int flags, DXT_family;
	int has_alpha, has_mipmap;
	int is_compressed, cubemap_faces;
	int block_pitch, num_blocks;
	DDS_header header;
	int i, sz, cf;
	//	load the header
	if( sizeof( DDS_header ) != 128 )
	{
		return NULL;
	}
	getn( s, (stbi_uc*)(&header), 128 );
	//	and do some checking
	if( header.dwMagic != (('D' << 0) | ('D' << 8) | ('S' << 16) | (' ' << 24)) ) return NULL;
	if( header.dwSize != 124 ) return NULL;
	flags = DDSD_CAPS | DDSD_HEIGHT | DDSD_WIDTH | DDSD_PIXELFORMAT;
	if( (header.dwFlags & flags) != flags ) return NULL;
	/*	According to the MSDN spec, the dwFlags should contain
		DDSD_LINEARSIZE if it's compressed, or DDSD_PITCH if
		uncompressed.  Some DDS writers do not conform to the
		spec, so I need to make my reader more tolerant	*/
	if( header.sPixelFormat.dwSize != 32 ) return NULL;
	flags = DDPF_FOURCC | DDPF_RGB;
	if( (header.sPixelFormat.dwFlags & flags) == 0 ) return NULL;
	if( (header.sCaps.dwCaps1 & DDSCAPS_TEXTURE) == 0 ) return NULL;
	//	get the image data
	s->img_x = header.dwWidth;
	s->img_y = header.dwHeight;
	s->img_n = 4;
	is_compressed = (header.sPixelFormat.dwFlags & DDPF_FOURCC) / DDPF_FOURCC;
	has_alpha = (header.sPixelFormat.dwFlags & DDPF_ALPHAPIXELS) / DDPF_ALPHAPIXELS;
	has_mipmap = (header.sCaps.dwCaps1 & DDSCAPS_MIPMAP) && (header.dwMipMapCount > 1);
	cubemap_faces = (header.sCaps.dwCaps2 & DDSCAPS2_CUBEMAP) / DDSCAPS2_CUBEMAP;
	/*	I need cubemaps to have square faces	*/
	cubemap_faces &= (s->img_x == s->img_y);
	cubemap_faces *= 5;
	cubemap_faces += 1;
	block_pitch = (s->img_x+3) >> 2;
	num_blocks = block_pitch * ((s->img_y+3) >> 2);
	/*	let the user know what's going on	*/
	*x = s->img_x;
	*y = s->img_y;
	*comp = s->img_n;
	/*	is this uncompressed?	*/
	if( is_compressed )
	{
		/*	compressed	*/
		//	note: header.sPixelFormat.dwFourCC is something like (('D'<<0)|('X'<<8)|('T'<<16)|('1'<<24))
		DXT_family = 1 + (header.sPixelFormat.dwFourCC >> 24) - '1';
		if( (DXT_family < 1) || (DXT_family > 5) ) return NULL;
		/*	check the expected size...oops, nevermind...
			those non-compliant writers leave
			dwPitchOrLinearSize == 0	*/
		//	passed all the tests, get the RAM for decoding
		sz = (s->img_x)*(s->img_y)*4*cubemap_faces;
		dds_data = (unsigned char*)malloc( sz );
		/*	do this once for each face	*/
		for( cf = 0; cf < cubemap_faces; ++ cf )
		{
			//	now read and decode all the blocks
			for( i = 0; i < num_blocks; ++i )
			{
				//	where are we?
				int bx, by, bw=4, bh=4;
				int ref_x = 4 * (i % block_pitch);
				int ref_y = 4 * (i / block_pitch);
				//	get the next block's worth of compressed data, and decompress it
				if( DXT_family == 1 )
				{
					//	DXT1
					getn( s, compressed, 8 );
					stbi_decode_DXT1_block( block, compressed );
				} else if( DXT_family < 4 )
				{
					//	DXT2/3
					getn( s, compressed, 8 );
					stbi_decode_DXT23_alpha_block ( block, compressed );
					getn( s, compressed, 8 );
					stbi_decode_DXT_color_block ( block, compressed );
				} else
				{
					//	DXT4/5
					getn( s, compressed, 8 );
					stbi_decode_DXT45_alpha_block ( block, compressed );
					getn( s, compressed, 8 );
					stbi_decode_DXT_color_block ( block, compressed );
				}
				//	is this a partial block?
				if( ref_x + 4 > s->img_x )
				{
					bw = s->img_x - ref_x;
				}
				if( ref_y + 4 > s->img_y )
				{
					bh = s->img_y - ref_y;
				}
				//	now drop our decompressed data into the buffer
				for( by = 0; by < bh; ++by )
				{
					int idx = 4*((ref_y+by+cf*s->img_x)*s->img_x + ref_x);
					for( bx = 0; bx < bw*4; ++bx )
					{

						dds_data[idx+bx] = block[by*16+bx];
					}
				}
			}
			/*	done reading and decoding the main image...
				skip MIPmaps if present	*/
			if( has_mipmap )
			{
				int block_size = 16;
				if( DXT_family == 1 )
				{
					block_size = 8;
				}
				for( i = 1; i < header.dwMipMapCount; ++i )
				{
					int mx = s->img_x >> (i + 2);
					int my = s->img_y >> (i + 2);
					if( mx < 1 )
					{
						mx = 1;
					}
					if( my < 1 )
					{
						my = 1;
					}
					skip( s, mx*my*block_size );
				}
			}
		}/* per cubemap face */
	} else
	{
		/*	uncompressed	*/
		DXT_family = 0;
		s->img_n = 3;
		if( has_alpha )
		{
			s->img_n = 4;
		}
		*comp = s->img_n;
		sz = s->img_x*s->img_y*s->img_n*cubemap_faces;
		dds_data = (unsigned char*)malloc( sz );
		/*	do this once for each face	*/
		for( cf = 0; cf < cubemap_faces; ++ cf )
		{
			/*	read the main image for this face	*/
			getn( s, &dds_data[cf*s->img_x*s->img_y*s->img_n], s->img_x*s->img_y*s->img_n );
			/*	done reading and decoding the main image...
				skip MIPmaps if present	*/
			if( has_mipmap )
			{
				for( i = 1; i < header.dwMipMapCount; ++i )
				{
					int mx = s->img_x >> i;
					int my = s->img_y >> i;
					if( mx < 1 )
					{
						mx = 1;
					}
					if( my < 1 )
					{
						my = 1;
					}
					skip( s, mx*my*s->img_n );
				}
			}
		}
		/*	data was BGR, I need it RGB	*/
		for( i = 0; i < sz; i += s->img_n )
		{
			unsigned char temp = dds_data[i];
			dds_data[i] = dds_data[i+2];
			dds_data[i+2] = temp;
		}
	}
	/*	finished decompressing into RGBA,
		adjust the y size if we have a cubemap
		note: sz is already up to date	*/
	s->img_y *= cubemap_faces;
	*y = s->img_y;
	//	did the user want something else, or
	//	see if all the alpha values are 255 (i.e. no transparency)
	has_alpha = 0;
	if( s->img_n == 4)
	{
		for( i = 3; (i < sz) && (has_alpha == 0); i += 4 )
		{
			has_alpha |= (dds_data[i] < 255);
		}
	}
	if( (req_comp <= 4) && (req_comp >= 1) )
	{
		//	user has some requirements, meet them
		if( req_comp != s->img_n )
		{
			dds_data = convert_format( dds_data, s->img_n, req_comp, s->img_x, s->img_y );
			*comp = s->img_n;
		}
	} else
	{
		//	user had no requirements, only drop to RGB is no alpha
		if( (has_alpha == 0) && (s->img_n == 4) )
		{
			dds_data = convert_format( dds_data, 4, 3, s->img_x, s->img_y );
			*comp = 3;
		}
	}
	//	OK, done
	return dds_data;
}